

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void cppurses::detail::Screen::paint_resize_event(Widget *widg,Screen_descriptor *staged_tiles)

{
  ulong uVar1;
  size_t sVar2;
  Const_reference CVar3;
  bool bVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  size_t x;
  ulong x_00;
  size_t y;
  size_t y_00;
  Point point;
  Glyph local_58;
  key_type local_40;
  
  paint_empty_tiles(widg);
  cover_leftovers(widg,staged_tiles);
  uVar1 = (widg->screen_state_).optimize.resize_mask.offset_.x;
  y_00 = (widg->screen_state_).optimize.resize_mask.offset_.y;
  uVar6 = (widg->screen_state_).optimize.resize_mask.area_.height + y_00;
  sVar2 = (widg->screen_state_).optimize.resize_mask.area_.width;
  for (; x_00 = uVar1, y_00 < uVar6; y_00 = y_00 + 1) {
    for (; x_00 < sVar2 + uVar1; x_00 = x_00 + 1) {
      local_40.x = x_00;
      local_40.y = y_00;
      CVar3 = Screen_mask::at(&(widg->screen_state_).optimize.resize_mask,x_00,y_00);
      if (CVar3) {
        full_paint_single_point(widg,staged_tiles,&local_40);
      }
      else {
        bVar4 = (anonymous_namespace)::
                contains<std::unordered_map<cppurses::Point,cppurses::Glyph,std::hash<cppurses::Point>,std::equal_to<cppurses::Point>,std::allocator<std::pair<cppurses::Point_const,cppurses::Glyph>>>>
                          (&local_40,staged_tiles);
        if (bVar4) {
          pmVar5 = std::__detail::
                   _Map_base<cppurses::Point,_std::pair<const_cppurses::Point,_cppurses::Glyph>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Point>,_std::hash<cppurses::Point>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<cppurses::Point,_std::pair<const_cppurses::Point,_cppurses::Glyph>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>,_std::__detail::_Select1st,_std::equal_to<cppurses::Point>,_std::hash<cppurses::Point>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)staged_tiles,&local_40);
          Glyph::Glyph(&local_58,pmVar5);
          basic_paint_single_point(widg,&local_40,&local_58);
          if (local_58.brush.foreground_color_.initialized_ == true) {
            local_58.brush.foreground_color_.initialized_ = false;
          }
          if (local_58.brush.background_color_.initialized_ == true) {
            local_58.brush.background_color_.initialized_ = false;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Screen::paint_resize_event(Widget& widg,
                                const Screen_descriptor& staged_tiles)
{
    paint_empty_tiles(widg);
    cover_leftovers(widg, staged_tiles);
    const auto& new_space = widg.screen_state().optimize.resize_mask;
    const auto y_begin    = new_space.offset().y;
    const auto x_begin    = new_space.offset().x;
    const auto y_end      = y_begin + new_space.area().height;
    const auto x_end      = x_begin + new_space.area().width;
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            const Point point{x, y};
            if (new_space.at(x, y)) {
                full_paint_single_point(widg, staged_tiles, point);
            }
            else if (contains(point, staged_tiles)) {
                basic_paint_single_point(widg, point, staged_tiles.at(point));
            }
        }
    }
}